

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::CountDriversFunc::checkArguments
          (CountDriversFunc *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_5)

{
  SourceRange callRange;
  bool bVar1;
  Compilation *this_00;
  Type *pTVar2;
  Symbol *pSVar3;
  reference ppEVar4;
  SystemSubroutine *in_RCX;
  Args *in_RDX;
  undefined8 in_RSI;
  undefined1 uVar5;
  ASTContext *in_RDI;
  SourceLocation in_R8;
  size_t in_stack_00000010;
  size_t in_stack_00000018;
  Symbol *sym;
  Compilation *comp;
  DiagCode code;
  ASTContext *context_00;
  SourceLocation in_stack_fffffffffffffff8;
  
  uVar5 = (undefined1)((ulong)in_RSI >> 0x38);
  context_00 = in_RDI;
  this_00 = ASTContext::getCompilation((ASTContext *)0x96a87f);
  callRange.endLoc = in_stack_fffffffffffffff8;
  callRange.startLoc = in_R8;
  bVar1 = SystemSubroutine::checkArgCount
                    (in_RCX,context_00,(bool)uVar5,in_RDX,callRange,in_stack_00000010,
                     in_stack_00000018);
  uVar5 = (undefined1)((ulong)in_RCX >> 0x38);
  if (bVar1) {
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,0);
    pSVar3 = Expression::getSymbolReference((Expression *)in_R8,(bool)uVar5);
    if ((pSVar3 == (Symbol *)0x0) || (pSVar3->kind != Net)) {
      code.subsystem = SysFuncs;
      code.code = 0xc;
      ppEVar4 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                          (in_RDX,0);
      ASTContext::addDiag(in_RDI,code,(*ppEVar4)->sourceRange);
    }
    pTVar2 = Compilation::getBitType(this_00);
  }
  else {
    pTVar2 = Compilation::getErrorType(this_00);
  }
  return pTVar2;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 1, 6))
            return comp.getErrorType();

        auto sym = args[0]->getSymbolReference(/* allowPacked */ false);
        if (!sym || sym->kind != SymbolKind::Net)
            context.addDiag(diag::ExpectedNetRef, args[0]->sourceRange);

        return comp.getBitType();
    }